

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmFunctionContextAccess
                    (ExpressionContext *ctx,VmModule *module,ExprFunctionContextAccess *node)

{
  SynBase *source;
  VariableData *variable;
  SynIdentifier *pSVar1;
  TypeRef *pTVar2;
  TypeClass *pTVar3;
  VmValue *pVVar4;
  VmValue *address;
  VmValue *value;
  TypeClass *classType;
  TypeRef *refType;
  ExprFunctionContextAccess *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pTVar2 = getType<TypeRef>(node->function->contextType);
  if (pTVar2 == (TypeRef *)0x0) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xe07,
                  "VmValue *CompileVmFunctionContextAccess(ExpressionContext &, VmModule *, ExprFunctionContextAccess *)"
                 );
  }
  pTVar3 = getType<TypeClass>(pTVar2->subType);
  if (pTVar3 != (TypeClass *)0x0) {
    if ((pTVar3->super_TypeStruct).super_TypeBase.size == 0) {
      address = &CreateConstantPointer
                           (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                            (node->super_ExprBase).type,false)->super_VmValue;
    }
    else {
      source = (node->super_ExprBase).source;
      variable = node->contextVariable;
      pTVar2 = ExpressionContext::GetReferenceType(ctx,node->contextVariable->type);
      pVVar4 = anon_unknown.dwarf_aa461::CreateVariableAddress
                         (module,source,variable,&pTVar2->super_TypeBase);
      address = anon_unknown.dwarf_aa461::CreateLoad
                          (ctx,module,(node->super_ExprBase).source,node->contextVariable->type,
                           pVVar4,0);
      pSVar1 = node->contextVariable->name;
      (address->comment).begin = (pSVar1->name).begin;
      (address->comment).end = (pSVar1->name).end;
    }
    pVVar4 = anon_unknown.dwarf_aa461::CheckType(ctx,&node->super_ExprBase,address);
    return pVVar4;
  }
  __assert_fail("classType",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                ,0xe0b,
                "VmValue *CompileVmFunctionContextAccess(ExpressionContext &, VmModule *, ExprFunctionContextAccess *)"
               );
}

Assistant:

VmValue* CompileVmFunctionContextAccess(ExpressionContext &ctx, VmModule *module, ExprFunctionContextAccess *node)
{
	TypeRef *refType = getType<TypeRef>(node->function->contextType);

	assert(refType);

	TypeClass *classType = getType<TypeClass>(refType->subType);

	assert(classType);

	VmValue *value = NULL;

	if(classType->size == 0)
	{
		value = CreateConstantPointer(module->allocator, node->source, 0, NULL, node->type, false);
	}
	else
	{
		VmValue *address = CreateVariableAddress(module, node->source, node->contextVariable, ctx.GetReferenceType(node->contextVariable->type));

		value = CreateLoad(ctx, module, node->source, node->contextVariable->type, address, 0);

		value->comment = node->contextVariable->name->name;
	}

	return CheckType(ctx, node, value);
}